

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O0

void __thiscall QLocalServerPrivate::setError(QLocalServerPrivate *this,QString *function)

{
  int *piVar1;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_fffffffffffffeb8;
  int n;
  int in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int iVar2;
  QString *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  QString *in_stack_fffffffffffffed8;
  QChar fillChar;
  undefined4 in_stack_fffffffffffffee0;
  int iVar3;
  QChar local_fc;
  QChar local_fa [4];
  QChar in_stack_ffffffffffffff0e;
  QChar local_aa [28];
  QChar local_72 [28];
  QChar local_3a [25];
  long local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = __errno_location();
  if (*piVar1 == 0xb) goto LAB_00385868;
  piVar1 = __errno_location();
  iVar3 = *piVar1;
  n = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  if (iVar3 != 2) {
    if (iVar3 == 0xd) {
      QLocalServer::tr((char *)in_stack_fffffffffffffec8,
                       (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),n);
      QChar::QChar<char16_t,_true>(local_3a,L' ');
      QString::arg<QString,_true>
                ((QString *)CONCAT44(iVar3,in_stack_fffffffffffffee0),in_RSI,iVar2,
                 in_stack_ffffffffffffff0e);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffeb8);
      QString::~QString((QString *)0x385629);
      QString::~QString((QString *)0x385636);
      *(undefined4 *)(in_RDI + 0xf0) = 3;
      goto LAB_00385868;
    }
    if ((((iVar3 != 0x14) && (iVar3 != 0x1e)) && (iVar3 != 0x24)) && (iVar3 != 0x28)) {
      if (iVar3 == 0x62) {
        QLocalServer::tr((char *)in_stack_fffffffffffffec8,
                         (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),n);
        QChar::QChar<char16_t,_true>(local_aa,L' ');
        QString::arg<QString,_true>
                  ((QString *)CONCAT44(iVar3,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8,
                   iVar2,in_stack_ffffffffffffff0e);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffeb8);
        QString::~QString((QString *)0x385773);
        QString::~QString((QString *)0x385780);
        *(undefined4 *)(in_RDI + 0xf0) = 8;
      }
      else {
        QLocalServer::tr((char *)in_stack_fffffffffffffec8,
                         (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),n);
        QChar::QChar<char16_t,_true>(local_fa,L' ');
        QString::arg<QString,_true>
                  ((QString *)CONCAT44(iVar3,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8,
                   iVar2,in_stack_ffffffffffffff0e);
        fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffffed8 >> 0x30);
        piVar1 = __errno_location();
        iVar2 = *piVar1;
        QChar::QChar<char16_t,_true>(&local_fc,L' ');
        QString::arg<int,_true>
                  (in_stack_fffffffffffffec8,iVar2,in_stack_fffffffffffffec0,
                   (int)((ulong)in_RSI >> 0x20),fillChar);
        QString::operator=((QString *)CONCAT44(iVar2,in_stack_fffffffffffffec0),in_RSI);
        QString::~QString((QString *)0x385845);
        QString::~QString((QString *)0x38584f);
        QString::~QString((QString *)0x385859);
        *(undefined4 *)(in_RDI + 0xf0) = 0xffffffff;
      }
      goto LAB_00385868;
    }
  }
  QLocalServer::tr((char *)in_stack_fffffffffffffec8,
                   (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),n);
  QChar::QChar<char16_t,_true>(local_72,L' ');
  QString::arg<QString,_true>
            ((QString *)CONCAT44(iVar3,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8,
             (int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffff0e);
  QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x3856ce);
  QString::~QString((QString *)0x3856db);
  *(undefined4 *)(in_RDI + 0xf0) = 2;
LAB_00385868:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalServerPrivate::setError(const QString &function)
{
    if (EAGAIN == errno)
        return;

    switch (errno) {
    case EACCES:
        errorString = QLocalServer::tr("%1: Permission denied").arg(function);
        error = QAbstractSocket::SocketAccessError;
        break;
    case ELOOP:
    case ENOENT:
    case ENAMETOOLONG:
    case EROFS:
    case ENOTDIR:
        errorString = QLocalServer::tr("%1: Name error").arg(function);
        error = QAbstractSocket::HostNotFoundError;
        break;
    case EADDRINUSE:
        errorString = QLocalServer::tr("%1: Address in use").arg(function);
        error = QAbstractSocket::AddressInUseError;
        break;

    default:
        errorString = QLocalServer::tr("%1: Unknown error %2")
                      .arg(function).arg(errno);
        error = QAbstractSocket::UnknownSocketError;
#if defined QLOCALSERVER_DEBUG
        qWarning() << errorString << "fullServerName:" << fullServerName;
#endif
    }
}